

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_Count.cc
# Opt level: O2

void __thiscall Pl_Count::~Pl_Count(Pl_Count *this)

{
  (this->super_Pipeline)._vptr_Pipeline = (_func_int **)&PTR__Pl_Count_002ac338;
  std::unique_ptr<Pl_Count::Members,_std::default_delete<Pl_Count::Members>_>::~unique_ptr(&this->m)
  ;
  Pipeline::~Pipeline(&this->super_Pipeline);
  return;
}

Assistant:

Pl_Count::~Pl_Count() // NOLINT (modernize-use-equals-default)
{
    // Must be explicit and not inline -- see QPDF_DLL_CLASS in README-maintainer
}